

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# claim_strategy.h
# Opt level: O0

int64_t __thiscall
disruptor::MultiThreadedStrategyEx::GetHighestPublishedSequence
          (MultiThreadedStrategyEx *this,int64_t lowerBound,int64_t availableSequence)

{
  bool bVar1;
  long in_RDX;
  MultiThreadedStrategyEx *in_RSI;
  int64_t sequence;
  MultiThreadedStrategyEx *local_28;
  
  local_28 = in_RSI;
  while( true ) {
    if (in_RDX < (long)local_28) {
      return in_RDX;
    }
    bVar1 = isAvailable(in_RSI,in_RDX);
    if (!bVar1) break;
    local_28 = (MultiThreadedStrategyEx *)((long)&local_28->buffer_size_ + 1);
  }
  return (int64_t)(undefined1 *)
                  ((long)&local_28[-1].available_buffer_.
                          super__Vector_base<std::atomic<int>,_std::allocator<std::atomic<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
}

Assistant:

int64_t GetHighestPublishedSequence(int64_t lowerBound,
                                      int64_t availableSequence) {
    for (int64_t sequence = lowerBound; sequence <= availableSequence;
         sequence++) {
      if (!isAvailable(sequence)) {
        return sequence - 1;
      }
    }

    return availableSequence;
  }